

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_component.cpp
# Opt level: O0

int __thiscall lsim::ModelComponent::copy(ModelComponent *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  ModelCircuit *pMVar2;
  bool bVar3;
  pointer pMVar4;
  pointer pPVar5;
  uptr_t local_68;
  reference local_60;
  value_type *prop_it;
  const_iterator __end1;
  const_iterator __begin1;
  property_lut_t *__range1;
  uint local_2c;
  int local_28 [2];
  unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_> local_20;
  __single_object clone;
  ModelComponent *this_local;
  
  local_28[0] = 0;
  local_28[1] = 0;
  local_2c = 0xffffffff;
  clone._M_t.super___uniq_ptr_impl<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>
  ._M_t.super__Tuple_impl<0UL,_lsim::ModelComponent_*,_std::default_delete<lsim::ModelComponent>_>.
  super__Head_base<0UL,_lsim::ModelComponent_*,_false>._M_head_impl =
       (__uniq_ptr_data<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>,_true,_true>
       )(__uniq_ptr_data<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>,_true,_true>
         )dst;
  std::
  make_unique<lsim::ModelComponent,decltype(nullptr),int,unsigned_int_const&,unsigned_int_const&,unsigned_int_const&,unsigned_int_const&>
            ((void **)&local_20,local_28,&local_2c,(uint *)(dst + 0xc),(uint *)(dst + 0x10),
             (uint *)(dst + 0x14));
  pMVar4 = std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>::
           operator->(&local_20);
  std::__cxx11::string::operator=((string *)&pMVar4->m_nested_name,(string *)(dst + 0x20));
  pMVar2 = *(ModelCircuit **)(dst + 0x40);
  pMVar4 = std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>::
           operator->(&local_20);
  pMVar4->m_nested_circuit = pMVar2;
  pMVar4 = std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>::
           operator->(&local_20);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::operator=(&pMVar4->m_port_lut,
              (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               *)(dst + 0x48));
  __end1 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::Property,_std::default_delete<lsim::Property>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::Property,_std::default_delete<lsim::Property>_>_>_>_>
           ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::Property,_std::default_delete<lsim::Property>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::Property,_std::default_delete<lsim::Property>_>_>_>_>
                    *)(dst + 0x80));
  prop_it = (value_type *)
            std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::Property,_std::default_delete<lsim::Property>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::Property,_std::default_delete<lsim::Property>_>_>_>_>
            ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::Property,_std::default_delete<lsim::Property>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::Property,_std::default_delete<lsim::Property>_>_>_>_>
                   *)(dst + 0x80));
  while( true ) {
    bVar3 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::Property,_std::default_delete<lsim::Property>_>_>,_true>
                       ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::Property,_std::default_delete<lsim::Property>_>_>,_true>
                         *)&prop_it);
    if (!bVar3) break;
    local_60 = std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::Property,_std::default_delete<lsim::Property>_>_>,_false,_true>
               ::operator*(&__end1);
    pMVar4 = std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>::
             operator->(&local_20);
    pPVar5 = std::unique_ptr<lsim::Property,_std::default_delete<lsim::Property>_>::operator->
                       (&local_60->second);
    (*pPVar5->_vptr_Property[3])(&local_68);
    add_property(pMVar4,&local_68);
    std::unique_ptr<lsim::Property,_std::default_delete<lsim::Property>_>::~unique_ptr(&local_68);
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::Property,_std::default_delete<lsim::Property>_>_>,_false,_true>
    ::operator++(&__end1);
  }
  pMVar4 = std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>::
           operator->(&local_20);
  pMVar4->m_position = *(Point *)(dst + 0xb8);
  iVar1 = *(int *)(dst + 0xc0);
  pMVar4 = std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>::
           operator->(&local_20);
  pMVar4->m_angle = iVar1;
  std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>::unique_ptr
            ((unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_> *)this,
             &local_20);
  std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>::~unique_ptr
            (&local_20);
  return (int)this;
}

Assistant:

ModelComponent::uptr_t ModelComponent::copy() const {
    auto clone = std::make_unique<ModelComponent>(nullptr, -1, m_type, m_inputs, m_outputs, m_controls);
    clone->m_nested_name = m_nested_name;
    clone->m_nested_circuit = m_nested_circuit;
    clone->m_port_lut = m_port_lut;
    for (const auto &prop_it : m_properties) {
        clone->add_property(prop_it.second->clone());
    }
    clone->m_position = m_position;
    clone->m_angle = m_angle;

    return std::move(clone);
}